

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void rename_op_reg(gen_ctx_t gen_ctx,MIR_op_t *op_ref,MIR_reg_t reg,MIR_reg_t new_reg,
                  MIR_insn_t insn,int print_p)

{
  MIR_context_t ctx;
  FILE *__stream;
  MIR_func_t func;
  char *pcVar1;
  char *pcVar2;
  
  if (reg < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5d8,
                  "void rename_op_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  ctx = gen_ctx->ctx;
  if (op_ref->field_0x8 == '\v') {
    if ((op_ref->u).mem.base == reg) {
      (op_ref->u).mem.base = new_reg;
      if ((op_ref->u).mem.index != reg) goto LAB_0016185e;
    }
    else if ((op_ref->u).mem.index != reg) {
      return;
    }
    (op_ref->u).mem.index = new_reg;
  }
  else {
    if (op_ref->field_0x8 != '\x02') {
      return;
    }
    if ((op_ref->u).reg != reg) {
      return;
    }
    (op_ref->u).reg = new_reg;
  }
LAB_0016185e:
  __stream = (FILE *)gen_ctx->debug_file;
  if ((__stream != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    func = (gen_ctx->curr_func_item->u).func;
    pcVar1 = MIR_reg_name(ctx,reg - 0x21,func);
    pcVar2 = MIR_reg_name(ctx,new_reg - 0x21,func);
    fprintf(__stream,"    Change %s to %s in insn %-5lu",pcVar1,pcVar2,
            (ulong)*(uint *)((long)insn->data + 0xc));
    print_bb_insn(gen_ctx,(bb_insn_t_conflict)insn->data,0);
    return;
  }
  return;
}

Assistant:

static void rename_op_reg (gen_ctx_t gen_ctx, MIR_op_t *op_ref, MIR_reg_t reg, MIR_reg_t new_reg,
                           MIR_insn_t insn, int print_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  int change_p = FALSE;

  gen_assert (reg > MAX_HARD_REG);
  if (op_ref->mode == MIR_OP_VAR && op_ref->u.var == reg) {
    op_ref->u.var = new_reg;
    change_p = TRUE;
  } else if (op_ref->mode == MIR_OP_VAR_MEM) {
    if (op_ref->u.var_mem.base == reg) {
      op_ref->u.var_mem.base = new_reg;
      change_p = TRUE;
    }
    if (op_ref->u.var_mem.index == reg) {
      op_ref->u.var_mem.index = new_reg;
      change_p = TRUE;
    }
  }
  if (!change_p || !print_p) return; /* definition was already changed from another use */
  DEBUG (2, {
    MIR_func_t func = curr_func_item->u.func;

    fprintf (debug_file, "    Change %s to %s in insn %-5lu",
             MIR_reg_name (ctx, reg - MAX_HARD_REG, func),
             MIR_reg_name (ctx, new_reg - MAX_HARD_REG, func),
             (long unsigned) ((bb_insn_t) insn->data)->index);
    print_bb_insn (gen_ctx, insn->data, FALSE);
  });
}